

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_OverrideChain_Test::TestBody(SSLTest_OverrideChain_Test *this)

{
  initializer_list<x509_st_*> __l;
  bool bVar1;
  char *pcVar2;
  stack_st_X509 *psVar3;
  pointer psVar4;
  SSL_METHOD *meth;
  pointer psVar5;
  X509 *x;
  EVP_PKEY *pkey;
  pointer server_ctx;
  char *message;
  pointer ssl;
  char *in_R9;
  string local_520;
  AssertHelper local_500;
  Message local_4f8;
  allocator<x509_st_*> local_4e9;
  pointer local_4e8;
  pointer local_4e0;
  iterator local_4d8;
  size_type local_4d0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_4c8;
  bool local_4a9;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_478;
  Message local_470;
  ClientConfig local_468;
  bool local_409;
  undefined1 local_408 [8];
  AssertionResult gtest_ar__13;
  UniquePtr<SSL> server;
  UniquePtr<SSL> client;
  AssertHelper local_3c8;
  Message local_3c0;
  int local_3b4;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_380;
  Message local_378;
  int local_36c;
  undefined1 local_368 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_338;
  Message local_330;
  int local_324;
  undefined1 local_320 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_2f0;
  Message local_2e8;
  int local_2dc;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_2a8;
  Message local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar__8;
  UniquePtr<SSL_CTX> ctx;
  AssertHelper local_260;
  Message local_258;
  UniquePtr<typename_internal::StackTraits<stack_st_X509>::Type> local_250;
  bool local_241;
  undefined1 local_240 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_210;
  Message local_208;
  UniquePtr<typename_internal::StackTraits<stack_st_X509>::Type> local_200;
  bool local_1f1;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__5;
  UniquePtr<struct_stack_st_X509> wrong_chain;
  AssertHelper local_178;
  Message local_170;
  UniquePtr<typename_internal::StackTraits<stack_st_X509>::Type> local_168;
  bool local_159;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_128;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<struct_stack_st_X509> chain;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<X509> ca;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<X509> leaf;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<EVP_PKEY> key;
  SSLTest_OverrideChain_Test *this_local;
  
  GetChainTestKey();
  testing::AssertionResult::AssertionResult<std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x53d8b1,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x137f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    GetChainTestCertificate();
    testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,
               (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&ca,(internal *)local_88,(AssertionResult *)"leaf","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1381,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&ca);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      GetChainTestIntermediate();
      testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_d0,
                 (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&chain,(internal *)local_d0,(AssertionResult *)0x4ff00e,"false","true",
                   in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1383,pcVar2);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&chain);
        testing::Message::~Message(&local_d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (bVar1) {
        psVar3 = sk_X509_new_null();
        std::unique_ptr<stack_st_X509,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<stack_st_X509,bssl::internal::Deleter> *)&gtest_ar__3.message_,psVar3
                  );
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<stack_st_X509,bssl::internal::Deleter>>
                  ((AssertionResult *)local_118,
                   (unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                   (type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
        if (!bVar1) {
          testing::Message::Message(&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_118,
                     (AssertionResult *)0x4de396,"false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1386,pcVar2);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_120);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
        if (bVar1) {
          psVar4 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get
                             ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)
                              &gtest_ar__3.message_);
          UpRef((bssl *)&local_168,(UniquePtr<X509> *)&gtest_ar__2.message_);
          local_159 = PushToStack<stack_st_X509>(psVar4,&local_168);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_158,&local_159,(type *)0x0);
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_168);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
          if (!bVar1) {
            testing::Message::Message(&local_170);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&wrong_chain,(internal *)local_158,
                       (AssertionResult *)"bssl::PushToStack(chain.get(), bssl::UpRef(ca))","false",
                       "true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,4999,pcVar2);
            testing::internal::AssertHelper::operator=(&local_178,&local_170);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            std::__cxx11::string::~string((string *)&wrong_chain);
            testing::Message::~Message(&local_170);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
          if (bVar1) {
            psVar3 = sk_X509_new_null();
            std::unique_ptr<stack_st_X509,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<stack_st_X509,bssl::internal::Deleter> *)&gtest_ar__5.message_,
                       psVar3);
            testing::AssertionResult::
            AssertionResult<std::unique_ptr<stack_st_X509,bssl::internal::Deleter>>
                      ((AssertionResult *)local_1b0,
                       (unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&gtest_ar__5.message_,
                       (type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
            if (!bVar1) {
              testing::Message::Message(&local_1b8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_1b0,
                         (AssertionResult *)"wrong_chain","false","true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1c0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x138a,pcVar2);
              testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
              testing::internal::AssertHelper::~AssertHelper(&local_1c0);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_1b8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
            if (bVar1) {
              psVar4 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get
                                 ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)
                                  &gtest_ar__5.message_);
              UpRef((bssl *)&local_200,(UniquePtr<X509> *)&gtest_ar__1.message_);
              local_1f1 = PushToStack<stack_st_X509>(psVar4,&local_200);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_1f0,&local_1f1,(type *)0x0);
              std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_200);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
              if (!bVar1) {
                testing::Message::Message(&local_208);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__7.message_,(internal *)local_1f0,
                           (AssertionResult *)
                           "bssl::PushToStack(wrong_chain.get(), bssl::UpRef(leaf))","false","true",
                           in_R9);
                pcVar2 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_210,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x138b,pcVar2);
                testing::internal::AssertHelper::operator=(&local_210,&local_208);
                testing::internal::AssertHelper::~AssertHelper(&local_210);
                std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_208);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
              if (bVar1) {
                psVar4 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get
                                   ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)
                                    &gtest_ar__5.message_);
                UpRef((bssl *)&local_250,(UniquePtr<X509> *)&gtest_ar__1.message_);
                local_241 = PushToStack<stack_st_X509>(psVar4,&local_250);
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_240,&local_241,(type *)0x0);
                std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_250);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_240);
                if (!bVar1) {
                  testing::Message::Message(&local_258);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&ctx,(internal *)local_240,
                             (AssertionResult *)
                             "bssl::PushToStack(wrong_chain.get(), bssl::UpRef(leaf))","false",
                             "true",in_R9);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_260,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x138c,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_260,&local_258);
                  testing::internal::AssertHelper::~AssertHelper(&local_260);
                  std::__cxx11::string::~string((string *)&ctx);
                  testing::Message::~Message(&local_258);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
                if (bVar1) {
                  meth = (SSL_METHOD *)TLS_method();
                  psVar5 = (pointer)SSL_CTX_new(meth);
                  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::
                  unique_ptr<bssl::internal::Deleter,void>
                            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&gtest_ar__8.message_
                             ,psVar5);
                  testing::AssertionResult::
                  AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
                            ((AssertionResult *)local_298,
                             (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                             &gtest_ar__8.message_,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_298);
                  if (!bVar1) {
                    testing::Message::Message(&local_2a0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__9.message_,(internal *)local_298,
                               (AssertionResult *)0x4d86cd,"false","true",in_R9);
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_2a8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x138f,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
                    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
                    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                    testing::Message::~Message(&local_2a0);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
                  if (bVar1) {
                    psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                        &gtest_ar__8.message_);
                    x = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                          ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                           &gtest_ar__1.message_);
                    local_2dc = SSL_CTX_use_certificate((SSL_CTX *)psVar5,x);
                    testing::AssertionResult::AssertionResult<int>
                              ((AssertionResult *)local_2d8,&local_2dc,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_2d8);
                    if (!bVar1) {
                      testing::Message::Message(&local_2e8);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__10.message_,(internal *)local_2d8,
                                 (AssertionResult *)"SSL_CTX_use_certificate(ctx.get(), leaf.get())"
                                 ,"false","true",in_R9);
                      pcVar2 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_2f0,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x1390,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
                      testing::internal::AssertHelper::~AssertHelper(&local_2f0);
                      std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                      testing::Message::~Message(&local_2e8);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
                    if (bVar1) {
                      psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__8.message_);
                      pkey = (EVP_PKEY *)
                             std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                      local_324 = SSL_CTX_use_PrivateKey((SSL_CTX *)psVar5,pkey);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_320,&local_324,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_320);
                      if (!bVar1) {
                        testing::Message::Message(&local_330);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__11.message_,(internal *)local_320,
                                   (AssertionResult *)"SSL_CTX_use_PrivateKey(ctx.get(), key.get())"
                                   ,"false","true",in_R9);
                        pcVar2 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_338,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x1391,pcVar2);
                        testing::internal::AssertHelper::operator=(&local_338,&local_330);
                        testing::internal::AssertHelper::~AssertHelper(&local_338);
                        std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
                        testing::Message::~Message(&local_330);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
                      if (bVar1) {
                        psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                            &gtest_ar__8.message_);
                        psVar4 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get
                                           ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)
                                            &gtest_ar__5.message_);
                        local_36c = SSL_CTX_set1_chain(psVar5,psVar4);
                        testing::AssertionResult::AssertionResult<int>
                                  ((AssertionResult *)local_368,&local_36c,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_368);
                        if (!bVar1) {
                          testing::Message::Message(&local_378);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar__12.message_,(internal *)local_368,
                                     (AssertionResult *)
                                     "SSL_CTX_set1_chain(ctx.get(), wrong_chain.get())","false",
                                     "true",in_R9);
                          pcVar2 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_380,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                     ,0x1395,pcVar2);
                          testing::internal::AssertHelper::operator=(&local_380,&local_378);
                          testing::internal::AssertHelper::~AssertHelper(&local_380);
                          std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                          testing::Message::~Message(&local_378);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
                        if (bVar1) {
                          psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__8.message_);
                          psVar4 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get
                                             ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)
                                              &gtest_ar__3.message_);
                          local_3b4 = SSL_CTX_set1_chain(psVar5,psVar4);
                          testing::AssertionResult::AssertionResult<int>
                                    ((AssertionResult *)local_3b0,&local_3b4,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_3b0);
                          if (!bVar1) {
                            testing::Message::Message(&local_3c0);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&client,(internal *)local_3b0,
                                       (AssertionResult *)
                                       "SSL_CTX_set1_chain(ctx.get(), chain.get())","false","true",
                                       in_R9);
                            pcVar2 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_3c8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                       ,0x1396,pcVar2);
                            testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
                            testing::internal::AssertHelper::~AssertHelper(&local_3c8);
                            std::__cxx11::string::~string((string *)&client);
                            testing::Message::~Message(&local_3c0);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
                          if (bVar1) {
                            std::unique_ptr<ssl_st,bssl::internal::Deleter>::
                            unique_ptr<bssl::internal::Deleter,void>
                                      ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&server);
                            std::unique_ptr<ssl_st,bssl::internal::Deleter>::
                            unique_ptr<bssl::internal::Deleter,void>
                                      ((unique_ptr<ssl_st,bssl::internal::Deleter> *)
                                       &gtest_ar__13.message_);
                            psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                                &gtest_ar__8.message_);
                            server_ctx = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                                   ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>
                                                     *)&gtest_ar__8.message_);
                            local_468.verify_hostname.field_2._M_allocated_capacity = 0;
                            local_468.verify_hostname.field_2._8_8_ = 0;
                            local_468.verify_hostname._M_dataplus = (_Alloc_hider)0x0;
                            local_468.verify_hostname._1_7_ = 0;
                            local_468.verify_hostname._M_string_length = 0;
                            local_468.servername.field_2._M_allocated_capacity = 0;
                            local_468.servername.field_2._8_8_ = 0;
                            local_468.servername._M_dataplus = (_Alloc_hider)0x0;
                            local_468.servername._1_7_ = 0;
                            local_468.servername._M_string_length = 0;
                            local_468.session = (SSL_SESSION *)0x0;
                            local_468.ca_names = (stack_st_CRYPTO_BUFFER *)0x0;
                            local_468.hostflags = 0;
                            local_468.early_data = false;
                            local_468._85_3_ = 0;
                            ClientConfig::ClientConfig(&local_468);
                            pcVar2 = (char *)0x1;
                            local_409 = ConnectClientAndServer
                                                  (&server,(UniquePtr<SSL> *)&gtest_ar__13.message_,
                                                   psVar5,server_ctx,&local_468,true);
                            testing::AssertionResult::AssertionResult<bool>
                                      ((AssertionResult *)local_408,&local_409,(type *)0x0);
                            ClientConfig::~ClientConfig(&local_468);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_408);
                            if (!bVar1) {
                              testing::Message::Message(&local_470);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar__14.message_,(internal *)local_408,
                                         (AssertionResult *)
                                         "ConnectClientAndServer(&client, &server, ctx.get(), ctx.get())"
                                         ,"false","true",pcVar2);
                              message = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_478,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                         ,0x1399,message);
                              testing::internal::AssertHelper::operator=(&local_478,&local_470);
                              testing::internal::AssertHelper::~AssertHelper(&local_478);
                              std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
                              testing::Message::~Message(&local_470);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_408)
                            ;
                            if (bVar1) {
                              ssl = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
                              psVar3 = SSL_get_peer_full_cert_chain(ssl);
                              local_4e8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *
                                                     )&gtest_ar__1.message_);
                              local_4e0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *
                                                     )&gtest_ar__2.message_);
                              local_4d8 = &local_4e8;
                              local_4d0 = 2;
                              std::allocator<x509_st_*>::allocator(&local_4e9);
                              __l._M_len = local_4d0;
                              __l._M_array = local_4d8;
                              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                        (&local_4c8,__l,&local_4e9);
                              local_4a9 = ChainsEqual(psVar3,&local_4c8);
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_4a8,&local_4a9,(type *)0x0);
                              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector
                                        (&local_4c8);
                              std::allocator<x509_st_*>::~allocator(&local_4e9);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_4a8);
                              if (!bVar1) {
                                testing::Message::Message(&local_4f8);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          (&local_520,(internal *)local_4a8,
                                           (AssertionResult *)
                                           "ChainsEqual(SSL_get_peer_full_cert_chain(client.get()), {leaf.get(), ca.get()})"
                                           ,"false","true",pcVar2);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_500,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                           ,0x139b,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
                                testing::internal::AssertHelper::~AssertHelper(&local_500);
                                std::__cxx11::string::~string((string *)&local_520);
                                testing::Message::~Message(&local_4f8);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_4a8);
                            }
                            std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                                      ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                       &gtest_ar__13.message_);
                            std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
                          }
                        }
                      }
                    }
                  }
                  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                             &gtest_ar__8.message_);
                }
              }
            }
            std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&gtest_ar__5.message_);
          }
        }
        std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SSLTest, OverrideChain) {
  bssl::UniquePtr<EVP_PKEY> key = GetChainTestKey();
  ASSERT_TRUE(key);
  bssl::UniquePtr<X509> leaf = GetChainTestCertificate();
  ASSERT_TRUE(leaf);
  bssl::UniquePtr<X509> ca = GetChainTestIntermediate();
  ASSERT_TRUE(ca);

  bssl::UniquePtr<STACK_OF(X509)> chain(sk_X509_new_null());
  ASSERT_TRUE(chain);
  ASSERT_TRUE(bssl::PushToStack(chain.get(), bssl::UpRef(ca)));

  bssl::UniquePtr<STACK_OF(X509)> wrong_chain(sk_X509_new_null());
  ASSERT_TRUE(wrong_chain);
  ASSERT_TRUE(bssl::PushToStack(wrong_chain.get(), bssl::UpRef(leaf)));
  ASSERT_TRUE(bssl::PushToStack(wrong_chain.get(), bssl::UpRef(leaf)));

  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);
  ASSERT_TRUE(SSL_CTX_use_certificate(ctx.get(), leaf.get()));
  ASSERT_TRUE(SSL_CTX_use_PrivateKey(ctx.get(), key.get()));

  // Configure one chain, then replace it with another. Note this API considers
  // the chain to exclude the leaf.
  ASSERT_TRUE(SSL_CTX_set1_chain(ctx.get(), wrong_chain.get()));
  ASSERT_TRUE(SSL_CTX_set1_chain(ctx.get(), chain.get()));

  bssl::UniquePtr<SSL> client, server;
  ASSERT_TRUE(ConnectClientAndServer(&client, &server, ctx.get(), ctx.get()));
  EXPECT_TRUE(ChainsEqual(SSL_get_peer_full_cert_chain(client.get()),
                          {leaf.get(), ca.get()}));
}